

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O3

int __thiscall cmCPackIFWPackage::ConfigureFromGroup(cmCPackIFWPackage *this,string *groupName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCPackIFWGenerator *this_00;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  char *pcVar6;
  size_type *psVar7;
  long *plVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string prefix;
  cmCPackComponentGroup group;
  string local_130;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  string local_f0;
  undefined1 local_d0 [32];
  _Alloc_hider local_b0;
  char *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  char *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  byte local_70;
  pointer local_68;
  pointer ppcStack_60;
  pointer local_58;
  cmCPackComponentGroup *pcStack_50;
  pointer local_48;
  pointer ppcStack_40;
  pointer local_38;
  
  local_d0._0_8_ = local_d0 + 0x10;
  local_d0._8_8_ = 0;
  local_d0[0x10] = '\0';
  local_b0._M_p = (pointer)&local_a0;
  local_a8 = (char *)0x0;
  local_a0._M_local_buf[0] = '\0';
  local_90._M_p = (pointer)&local_80;
  local_88 = (char *)0x0;
  local_80._M_local_buf[0] = '\0';
  local_68 = (pointer)0x0;
  ppcStack_60 = (pointer)0x0;
  local_58 = (pointer)0x0;
  pcStack_50 = (cmCPackComponentGroup *)0x0;
  local_48 = (pointer)0x0;
  ppcStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  cmsys::SystemTools::UpperCase(&local_f0,groupName);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x5adbc2);
  paVar1 = &local_130.field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_130.field_2._M_allocated_capacity = *psVar7;
    local_130.field_2._8_8_ = plVar5[3];
    local_130._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_130.field_2._M_allocated_capacity = *psVar7;
    local_130._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_130._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
  local_110 = &local_100;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_100 = *plVar8;
    lStack_f8 = plVar5[3];
  }
  else {
    local_100 = *plVar8;
    local_110 = (long *)*plVar5;
  }
  local_108 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  local_130._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,local_110,local_108 + (long)local_110);
  std::__cxx11::string::append((char *)&local_130);
  pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = local_a8;
  if (pcVar6 == (char *)0x0) {
    std::__cxx11::string::_M_assign((string *)&local_b0);
  }
  else {
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&local_b0,0,pcVar2,(ulong)pcVar6);
  }
  local_130._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,local_110,local_108 + (long)local_110);
  std::__cxx11::string::append((char *)&local_130);
  pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = local_88;
  if (pcVar6 != (char *)0x0) {
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&local_90,0,pcVar2,(ulong)pcVar6);
  }
  local_130._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,local_110,local_108 + (long)local_110);
  std::__cxx11::string::append((char *)&local_130);
  bVar3 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,&local_130);
  local_70 = local_70 & 0xfe | bVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  local_130._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,local_110,local_108 + (long)local_110);
  std::__cxx11::string::append((char *)&local_130);
  bVar3 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,&local_130);
  local_70 = local_70 & 0xfd | bVar3 * '\x02';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_assign((string *)local_d0);
  this_00 = (this->super_cmCPackIFWCommon).Generator;
  if (this_00 == (cmCPackIFWGenerator *)0x0) {
    std::__cxx11::string::_M_assign((string *)&this->Name);
  }
  else {
    cmCPackIFWGenerator::GetGroupPackageName_abi_cxx11_
              (&local_130,this_00,(cmCPackComponentGroup *)local_d0);
    std::__cxx11::string::operator=((string *)&this->Name,(string *)&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
  }
  iVar4 = ConfigureFromGroup(this,(cmCPackComponentGroup *)local_d0);
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_48 != (pointer)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  if (local_68 != (pointer)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_p != &local_80) {
    operator_delete(local_90._M_p,
                    CONCAT71(local_80._M_allocated_capacity._1_7_,local_80._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_p != &local_a0) {
    operator_delete(local_b0._M_p,
                    CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,CONCAT71(local_d0._17_7_,local_d0[0x10]) + 1);
  }
  return iVar4;
}

Assistant:

int cmCPackIFWPackage::ConfigureFromGroup(const std::string& groupName)
{
  // Group configuration

  cmCPackComponentGroup group;
  std::string prefix =
    "CPACK_COMPONENT_GROUP_" + cmsys::SystemTools::UpperCase(groupName) + "_";

  if (const char* option = this->GetOption(prefix + "DISPLAY_NAME")) {
    group.DisplayName = option;
  } else {
    group.DisplayName = group.Name;
  }

  if (const char* option = this->GetOption(prefix + "DESCRIPTION")) {
    group.Description = option;
  }
  group.IsBold = this->IsOn(prefix + "BOLD_TITLE");
  group.IsExpandedByDefault = this->IsOn(prefix + "EXPANDED");

  // Package configuration

  group.Name = groupName;

  if (Generator) {
    this->Name = this->Generator->GetGroupPackageName(&group);
  } else {
    this->Name = group.Name;
  }

  return this->ConfigureFromGroup(&group);
}